

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageTests.cpp
# Opt level: O2

TestCaseGroup * vkt::pipeline::createImageTests(TestContext *testCtx)

{
  Precision PVar1;
  VkFormat format;
  int iVar2;
  pointer piVar3;
  _Alloc_hider name;
  bool bVar4;
  TestCaseGroup *pTVar5;
  TestNode *this;
  TestNode *this_00;
  TestNode *this_01;
  ostream *poVar6;
  TestCaseGroup *pTVar7;
  TestNode *this_02;
  TestNode *node;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  pointer pVVar12;
  ulong uVar13;
  char *pcVar14;
  ulong uVar15;
  long lVar16;
  Vector<int,_3> *v;
  long lStack_4b0;
  allocator<char> local_492;
  allocator<char> local_491;
  ulong local_490;
  vector<int,_std::allocator<int>_> arraySizes;
  vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_> imageSizes;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> samplingTypeTests;
  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> local_418;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> samplingTypeGroup;
  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> local_3f8;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> viewTypeGroup;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> formatGroup;
  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> local_3c8;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> countGroup;
  string fullName;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> imageTests;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  char *local_1c8 [4];
  ostringstream caseName;
  
  pTVar5 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar5,testCtx,"image","Image tests");
  imageTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = pTVar5;
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this,testCtx,"sampling_type","");
  lVar10 = 0;
  samplingTypeTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)this;
  do {
    pTVar5 = samplingTypeTests.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    pcVar14 = "separate";
    if (lVar10 == 2) {
      samplingTypeTests.
      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
           (TestCaseGroup *)0x0;
      tcu::TestNode::addChild
                (&(imageTests.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr)->super_TestNode,&pTVar5->super_TestNode);
      pTVar5 = imageTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr;
      imageTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data.ptr = (TestCaseGroup *)0x0;
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&samplingTypeTests.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&imageTests.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      return pTVar5;
    }
    if (lVar10 == 0) {
      pcVar14 = "combined";
    }
    pTVar5 = (TestCaseGroup *)operator_new(0x70);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"Uses a ",(allocator<char> *)local_1c8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&caseName,
                   &local_1e8,pcVar14);
    std::operator+(&fullName,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&caseName,
                   " sampler");
    tcu::TestCaseGroup::TestCaseGroup(pTVar5,testCtx,pcVar14,fullName._M_dataplus._M_p);
    samplingTypeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
    m_data.ptr = pTVar5;
    std::__cxx11::string::~string((string *)&fullName);
    std::__cxx11::string::~string((string *)&caseName);
    std::__cxx11::string::~string((string *)&local_1e8);
    PVar1 = vkt::sr::anon_unknown_0::ShaderMatrixTests::init::precisions[lVar10];
    this_00 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this_00,testCtx,"view_type","");
    lVar16 = 0;
    local_418.m_data.ptr = (TestCaseGroup *)this_00;
    while( true ) {
      pTVar5 = local_418.m_data.ptr;
      if (lVar16 == 7) break;
      local_490 = (ulong)(uint)(&DAT_00bcd2b0)[lVar16 * 4];
      pTVar5 = (TestCaseGroup *)operator_new(0x70);
      pcVar14 = (char *)(&DAT_00bcd2b8)[lVar16 * 2];
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,"Uses a ",(allocator<char> *)local_1c8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&caseName,
                     &local_1e8,pcVar14);
      std::operator+(&fullName,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&caseName,
                     " view");
      tcu::TestCaseGroup::TestCaseGroup(pTVar5,testCtx,pcVar14,fullName._M_dataplus._M_p);
      viewTypeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data.ptr = pTVar5;
      std::__cxx11::string::~string((string *)&fullName);
      std::__cxx11::string::~string((string *)&caseName);
      std::__cxx11::string::~string((string *)&local_1e8);
      this_01 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)this_01,testCtx,"format","Tests samplable formats");
      lVar9 = 0;
      local_3f8.m_data.ptr = (TestCaseGroup *)this_01;
      while( true ) {
        if (lVar9 == 0x75) break;
        format = *(VkFormat *)(&DAT_00954720 + lVar9 * 4);
        bVar4 = ::vk::isCompressedFormat(format);
        if ((local_490 & 0xfffffffb) == 0 && bVar4) break;
        pTVar5 = (TestCaseGroup *)operator_new(0x70);
        pcVar14 = ::vk::getFormatName(format);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&fullName,pcVar14,(allocator<char> *)&caseName);
        std::__cxx11::string::substr((ulong)&caseName,(ulong)&fullName);
        de::toLower(&local_1e8,(string *)&caseName);
        std::__cxx11::string::~string((string *)&caseName);
        std::__cxx11::string::~string((string *)&fullName);
        name._M_p = local_1e8._M_dataplus._M_p;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&caseName,"Samples a texture of format ",(allocator<char> *)local_1c8);
        pcVar14 = ::vk::getFormatName(format);
        std::operator+(&fullName,(string *)&caseName,pcVar14);
        tcu::TestCaseGroup::TestCaseGroup(pTVar5,testCtx,name._M_p,fullName._M_dataplus._M_p);
        formatGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
        m_data.ptr = pTVar5;
        std::__cxx11::string::~string((string *)&fullName);
        std::__cxx11::string::~string((string *)&caseName);
        std::__cxx11::string::~string((string *)&local_1e8);
        pTVar5 = formatGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr;
        lVar8 = 0;
        while( true ) {
          pTVar7 = formatGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr;
          if (lVar8 == 3) break;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&caseName);
          poVar6 = std::operator<<((ostream *)&caseName,"count_");
          iVar2 = *(int *)(&DAT_009548f4 + lVar8 * 4);
          std::ostream::operator<<(poVar6,iVar2);
          pTVar7 = (TestCaseGroup *)operator_new(0x70);
          std::__cxx11::stringbuf::str();
          tcu::TestCaseGroup::TestCaseGroup(pTVar7,testCtx,fullName._M_dataplus._M_p,"");
          countGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
          m_data.ptr = pTVar7;
          std::__cxx11::string::~string((string *)&fullName);
          imageSizes.super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          imageSizes.super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          imageSizes.super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          this_02 = (TestNode *)operator_new(0x70);
          tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this_02,testCtx,"size","");
          local_3c8.m_data.ptr = (TestCaseGroup *)this_02;
          switch(local_490 & 0xffffffff) {
          case 0:
          case 4:
            if (lVar8 == 0) {
              fullName._M_dataplus._M_p = (pointer)0x100000001;
              fullName._M_string_length._0_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)
                         &imageSizes,(Vector<int,_3> *)&fullName);
              fullName._M_dataplus._M_p = (pointer)0x100000002;
              fullName._M_string_length._0_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)
                         &imageSizes,(Vector<int,_3> *)&fullName);
              fullName._M_dataplus._M_p = (pointer)0x100000020;
              fullName._M_string_length._0_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)
                         &imageSizes,(Vector<int,_3> *)&fullName);
              fullName._M_dataplus._M_p = (pointer)0x100000080;
              fullName._M_string_length._0_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)
                         &imageSizes,(Vector<int,_3> *)&fullName);
            }
            fullName._M_dataplus._M_p = (pointer)0x100000200;
            fullName._M_string_length._0_4_ = 1;
            std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
            emplace_back<tcu::Vector<int,3>>
                      ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&imageSizes,
                       (Vector<int,_3> *)&fullName);
            if (lVar8 == 0) {
              fullName._M_dataplus._M_p = (pointer)0x100000003;
              fullName._M_string_length._0_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)
                         &imageSizes,(Vector<int,_3> *)&fullName);
              fullName._M_dataplus._M_p = (pointer)0x10000000d;
              fullName._M_string_length._0_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)
                         &imageSizes,(Vector<int,_3> *)&fullName);
              fullName._M_dataplus._M_p = (pointer)0x10000007f;
              fullName._M_string_length._0_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)
                         &imageSizes,(Vector<int,_3> *)&fullName);
            }
            fullName._M_dataplus._M_p = (pointer)0x1000001bb;
            fullName._M_string_length._0_4_ = 1;
            std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
            emplace_back<tcu::Vector<int,3>>
                      ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&imageSizes,
                       (Vector<int,_3> *)&fullName);
            break;
          case 1:
          case 5:
            if (lVar8 == 0) {
              fullName._M_dataplus._M_p = (pointer)0x100000001;
              fullName._M_string_length._0_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)
                         &imageSizes,(Vector<int,_3> *)&fullName);
              fullName._M_dataplus._M_p = &DAT_200000002;
              fullName._M_string_length._0_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)
                         &imageSizes,(Vector<int,_3> *)&fullName);
              fullName._M_dataplus._M_p = (pointer)0x2000000020;
              fullName._M_string_length._0_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)
                         &imageSizes,(Vector<int,_3> *)&fullName);
              fullName._M_dataplus._M_p = (pointer)0x300000003;
              fullName._M_string_length._0_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)
                         &imageSizes,(Vector<int,_3> *)&fullName);
              fullName._M_dataplus._M_p = (pointer)0xd0000000d;
              fullName._M_string_length._0_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)
                         &imageSizes,(Vector<int,_3> *)&fullName);
              fullName._M_dataplus._M_p = (pointer)0x1000000008;
              fullName._M_string_length._0_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)
                         &imageSizes,(Vector<int,_3> *)&fullName);
            }
            fullName._M_dataplus._M_p = (pointer)0x1000000020;
            fullName._M_string_length._0_4_ = 1;
            std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
            emplace_back<tcu::Vector<int,3>>
                      ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&imageSizes,
                       (Vector<int,_3> *)&fullName);
            fullName._M_dataplus._M_p = (pointer)0x170000000d;
            fullName._M_string_length._0_4_ = 1;
            std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
            emplace_back<tcu::Vector<int,3>>
                      ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&imageSizes,
                       (Vector<int,_3> *)&fullName);
            if (lVar8 == 0) {
              fullName._M_dataplus._M_p = (pointer)0x800000017;
              fullName._M_string_length._0_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)
                         &imageSizes,(Vector<int,_3> *)&fullName);
            }
            break;
          case 2:
            if (lVar8 == 0) {
              fullName._M_dataplus._M_p = (pointer)0x100000001;
              fullName._M_string_length._0_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)
                         &imageSizes,(Vector<int,_3> *)&fullName);
              fullName._M_dataplus._M_p = &DAT_200000002;
              fullName._M_string_length._0_4_ = 2;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)
                         &imageSizes,(Vector<int,_3> *)&fullName);
            }
            fullName._M_dataplus._M_p = (pointer)0x1000000010;
            fullName._M_string_length._0_4_ = 0x10;
            std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
            emplace_back<tcu::Vector<int,3>>
                      ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&imageSizes,
                       (Vector<int,_3> *)&fullName);
            if (lVar8 == 0) {
              fullName._M_dataplus._M_p = (pointer)0x300000003;
              fullName._M_string_length._0_4_ = 3;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)
                         &imageSizes,(Vector<int,_3> *)&fullName);
              fullName._M_dataplus._M_p = (pointer)0x500000005;
              fullName._M_string_length._0_4_ = 5;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)
                         &imageSizes,(Vector<int,_3> *)&fullName);
            }
            fullName._M_dataplus._M_p = (pointer)0xb0000000b;
            fullName._M_string_length._0_4_ = 0xb;
            std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
            emplace_back<tcu::Vector<int,3>>
                      ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&imageSizes,
                       (Vector<int,_3> *)&fullName);
            if (lVar8 == 0) {
              fullName._M_dataplus._M_p = (pointer)0x1000000020;
              fullName._M_string_length._0_4_ = 8;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)
                         &imageSizes,(Vector<int,_3> *)&fullName);
            }
            fullName._M_dataplus._M_p = (pointer)0x1000000008;
            fullName._M_string_length._0_4_ = 0x20;
            std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
            emplace_back<tcu::Vector<int,3>>
                      ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&imageSizes,
                       (Vector<int,_3> *)&fullName);
            fullName._M_dataplus._M_p = (pointer)0xb00000011;
            fullName._M_string_length._0_4_ = 5;
            std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
            emplace_back<tcu::Vector<int,3>>
                      ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&imageSizes,
                       (Vector<int,_3> *)&fullName);
            if (lVar8 == 0) {
              fullName._M_dataplus._M_p = (pointer)0xb00000005;
              fullName._M_string_length._0_4_ = 0x11;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)
                         &imageSizes,(Vector<int,_3> *)&fullName);
            }
            goto switchD_004d0abf_default;
          case 3:
          case 6:
            fullName._M_dataplus._M_p = (pointer)0x2000000020;
            fullName._M_string_length._0_4_ = 1;
            std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
            emplace_back<tcu::Vector<int,3>>
                      ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&imageSizes,
                       (Vector<int,_3> *)&fullName);
            fullName._M_dataplus._M_p = (pointer)0xd0000000d;
            fullName._M_string_length._0_4_ = 1;
            std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
            emplace_back<tcu::Vector<int,3>>
                      ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&imageSizes,
                       (Vector<int,_3> *)&fullName);
            break;
          default:
            goto switchD_004d0abf_default;
          }
          iVar11 = (int)local_490;
          if (iVar11 - 4U < 2) {
            if (lVar8 == 0) {
              fullName._M_dataplus._M_p._0_4_ = 3;
              std::vector<int,_std::allocator<int>_>::emplace_back<int>
                        (&arraySizes,(int *)&fullName);
            }
            fullName._M_dataplus._M_p._0_4_ = 6;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(&arraySizes,(int *)&fullName);
          }
          else if (iVar11 == 3) {
            fullName._M_dataplus._M_p._0_4_ = 6;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(&arraySizes,(int *)&fullName);
          }
          else if (iVar11 == 6) {
            if (lVar8 == 0) {
              fullName._M_dataplus._M_p._0_4_ = 6;
              std::vector<int,_std::allocator<int>_>::emplace_back<int>
                        (&arraySizes,(int *)&fullName);
            }
            fullName._M_dataplus._M_p._0_4_ = 0x24;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(&arraySizes,(int *)&fullName);
          }
          else {
switchD_004d0abf_default:
            fullName._M_dataplus._M_p._0_4_ = 1;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(&arraySizes,(int *)&fullName);
          }
          for (uVar13 = 0;
              uVar13 < (ulong)(((long)imageSizes.
                                      super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)imageSizes.
                                     super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) / 0xc);
              uVar13 = uVar13 + 1) {
            for (uVar15 = 0;
                piVar3 = arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                uVar15 < (ulong)((long)arraySizes.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                 (long)arraySizes.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start >> 2);
                uVar15 = uVar15 + 1) {
              node = (TestNode *)operator_new(0x90);
              pVVar12 = imageSizes.
                        super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar13;
              iVar11 = piVar3[uVar15];
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&fullName);
              if ((uint)local_490 < 7) {
                if ((0xbU >> ((uint)local_490 & 0x1f) & 1) == 0) {
                  if ((0x70U >> ((uint)local_490 & 0x1f) & 1) == 0) {
                    poVar6 = (ostream *)std::ostream::operator<<(&fullName,pVVar12->m_data[0]);
                    poVar6 = std::operator<<(poVar6,"x");
                    poVar6 = (ostream *)std::ostream::operator<<(poVar6,pVVar12->m_data[1]);
                    poVar6 = std::operator<<(poVar6,"x");
                    lStack_4b0 = 8;
                    goto LAB_004d123c;
                  }
                  poVar6 = (ostream *)std::ostream::operator<<(&fullName,pVVar12->m_data[0]);
                  poVar6 = std::operator<<(poVar6,"x");
                  poVar6 = (ostream *)std::ostream::operator<<(poVar6,pVVar12->m_data[1]);
                  poVar6 = std::operator<<(poVar6,"_array_of_");
                }
                else {
                  poVar6 = (ostream *)std::ostream::operator<<(&fullName,pVVar12->m_data[0]);
                  poVar6 = std::operator<<(poVar6,"x");
                  lStack_4b0 = 4;
LAB_004d123c:
                  iVar11 = *(int *)((long)pVVar12->m_data + lStack_4b0);
                }
                std::ostream::operator<<(poVar6,iVar11);
              }
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fullName);
              v = imageSizes.
                  super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar13;
              iVar11 = arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar15];
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&fullName,local_1c8[0],&local_491);
              std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"",&local_492)
              ;
              TestCase::TestCase((TestCase *)node,testCtx,&fullName,&local_1e8);
              std::__cxx11::string::~string((string *)&local_1e8);
              std::__cxx11::string::~string((string *)&fullName);
              node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bcd330;
              *(Precision *)&node[1]._vptr_TestNode = PVar1;
              *(int *)((long)&node[1]._vptr_TestNode + 4) = (int)local_490;
              *(VkFormat *)&node[1].m_testCtx = format;
              tcu::Vector<int,_3>::Vector((Vector<int,_3> *)((long)&node[1].m_testCtx + 4),v);
              *(int *)&node[1].m_name._M_string_length = iVar2;
              *(int *)((long)&node[1].m_name._M_string_length + 4) = iVar11;
              tcu::TestNode::addChild(this_02,node);
              std::__cxx11::string::~string((string *)local_1c8);
            }
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&arraySizes.super__Vector_base<int,_std::allocator<int>_>);
          std::_Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>::
          ~_Vector_base(&imageSizes.
                         super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>
                       );
          pTVar7 = local_3c8.m_data.ptr;
          local_3c8.m_data.ptr = (TestCaseGroup *)0x0;
          tcu::TestNode::addChild
                    (&(countGroup.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data.ptr)->super_TestNode,&pTVar7->super_TestNode);
          pTVar7 = countGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr;
          countGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
          m_data.ptr = (TestCaseGroup *)0x0;
          tcu::TestNode::addChild(&pTVar5->super_TestNode,&pTVar7->super_TestNode);
          de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
          ~UniqueBase(&local_3c8);
          de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
          ~UniqueBase(&countGroup.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                     );
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&caseName);
          lVar8 = lVar8 + 1;
        }
        formatGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
        m_data.ptr = (TestCaseGroup *)0x0;
        tcu::TestNode::addChild(this_01,&pTVar7->super_TestNode);
        de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
        ~UniqueBase(&formatGroup.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
        lVar9 = lVar9 + 1;
      }
      pTVar5 = local_3f8.m_data.ptr;
      local_3f8.m_data.ptr = (TestCaseGroup *)0x0;
      tcu::TestNode::addChild
                (&(viewTypeGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr)->super_TestNode,&pTVar5->super_TestNode);
      pTVar5 = viewTypeGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr;
      viewTypeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data.ptr = (TestCaseGroup *)0x0;
      tcu::TestNode::addChild(this_00,&pTVar5->super_TestNode);
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&local_3f8);
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&viewTypeGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      lVar16 = lVar16 + 1;
    }
    local_418.m_data.ptr = (TestCaseGroup *)0x0;
    tcu::TestNode::addChild
              (&(samplingTypeGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr)->super_TestNode,&pTVar5->super_TestNode);
    pTVar5 = samplingTypeGroup.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    samplingTypeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
    m_data.ptr = (TestCaseGroup *)0x0;
    tcu::TestNode::addChild(this,&pTVar5->super_TestNode);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&local_418);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&samplingTypeGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

tcu::TestCaseGroup* createImageTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> imageTests(new tcu::TestCaseGroup(testCtx, "image", "Image tests"));
	de::MovePtr<tcu::TestCaseGroup> samplingTypeTests = createImageSamplingTypeTests(testCtx);

	imageTests->addChild(samplingTypeTests.release());

	return imageTests.release();
}